

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_setBank(ADL_MIDIPlayer *device,int bank)

{
  MIDIplay *this;
  OPL3 *this_00;
  int iVar1;
  uint32_t bank_00;
  allocator local_d9;
  string local_d8;
  char errBuf [150];
  
  bank_00 = 0;
  if (0 < bank) {
    bank_00 = bank;
  }
  this = (MIDIplay *)device->adl_midiPlayer;
  if (this != (MIDIplay *)0x0) {
    if (bank_00 < 0x4e) {
      this_00 = (this->m_synth).m_p;
      (this->m_setup).bankId = bank_00;
      OPL3::setEmbeddedBank(this_00,bank_00);
      MIDIplay::applySetup(this);
      iVar1 = 0;
    }
    else {
      snprintf(errBuf,0x96,"Embedded bank number may only be 0..%u!\n",0x4d);
      std::__cxx11::string::string((string *)&local_d8,errBuf,&local_d9);
      MIDIplay::setErrorString(this,&local_d8);
      std::__cxx11::string::_M_dispose();
      iVar1 = -1;
    }
    return iVar1;
  }
  __assert_fail("play",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                ,0xd3,"int adl_setBank(ADL_MIDIPlayer *, int)");
}

Assistant:

ADLMIDI_EXPORT int adl_setBank(ADL_MIDIPlayer *device, int bank)
{
#ifdef DISABLE_EMBEDDED_BANKS
    ADL_UNUSED(bank);
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->setErrorString("This build of libADLMIDI has no embedded banks. "
                         "Please load banks by using adl_openBankFile() or "
                         "adl_openBankData() functions instead of adl_setBank().");
    return -1;
#else
    const uint32_t NumBanks = static_cast<uint32_t>(g_embeddedBanksCount);
    int32_t bankno = bank;

    if(bankno < 0)
        bankno = 0;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    if(static_cast<uint32_t>(bankno) >= NumBanks)
    {
        char errBuf[150];
        snprintf(errBuf, 150, "Embedded bank number may only be 0..%u!\n", static_cast<unsigned int>(NumBanks - 1));
        play->setErrorString(errBuf);
        return -1;
    }

    Synth &synth = *play->m_synth;
    play->m_setup.bankId = static_cast<uint32_t>(bankno);
    synth.setEmbeddedBank(play->m_setup.bankId);
    play->applySetup();

    return 0;
#endif
}